

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIService.h
# Opt level: O3

void libchess::UCIService::bestmove
               (string *move,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *ponder_move,ostream *out)

{
  string bestmove_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_50,"bestmove ",move);
  if ((ponder_move->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::operator+(&local_30," ponder ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ponder_move)
    ;
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)&local_50);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void bestmove(const std::string& move,
                         const std::optional<std::string>& ponder_move = {},
                         std::ostream& out = std::cout) noexcept {
        std::string bestmove_str = "bestmove " + move;
        if (ponder_move) {
            bestmove_str += " ponder " + *ponder_move;
        }
        bestmove_str += "\n";
        out << bestmove_str;
    }